

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbi.cpp
# Opt level: O0

int __thiscall icu_63::RuleBasedBreakIterator::init(RuleBasedBreakIterator *this,EVP_PKEY_CTX *ctx)

{
  UBool UVar1;
  undefined7 extraout_var;
  DictionaryCache *this_00;
  BreakCache *this_01;
  undefined7 extraout_var_00;
  BreakCache *local_68;
  DictionaryCache *local_58;
  UErrorCode *status_local;
  RuleBasedBreakIterator *this_local;
  RuleBasedBreakIterator *pRVar2;
  
  this->fCharIter = (CharacterIterator *)0x0;
  this->fData = (RBBIDataWrapper *)0x0;
  this->fPosition = 0;
  this->fRuleStatusIndex = 0;
  this->fDone = '\0';
  this->fDictionaryCharCount = 0;
  this->fLanguageBreakEngines = (UStack *)0x0;
  this->fUnhandledBreakEngine = (UnhandledEngine *)0x0;
  this->fBreakCache = (BreakCache *)0x0;
  this->fDictionaryCache = (DictionaryCache *)0x0;
  memcpy(&this->fText,&init::initializedUText,0x90);
  UVar1 = ::U_FAILURE(*(UErrorCode *)ctx);
  pRVar2 = (RuleBasedBreakIterator *)CONCAT71(extraout_var,UVar1);
  if (UVar1 == '\0') {
    pRVar2 = (RuleBasedBreakIterator *)0x0;
    utext_openUChars_63(&this->fText,(UChar *)0x0,0,(UErrorCode *)ctx);
    this_00 = (DictionaryCache *)UMemory::operator_new((UMemory *)0x40,(size_t)pRVar2);
    local_58 = (DictionaryCache *)0x0;
    if (this_00 != (DictionaryCache *)0x0) {
      pRVar2 = this;
      DictionaryCache::DictionaryCache(this_00,this,(UErrorCode *)ctx);
      local_58 = this_00;
    }
    this->fDictionaryCache = local_58;
    this_01 = (BreakCache *)UMemory::operator_new((UMemory *)0x340,(size_t)pRVar2);
    local_68 = (BreakCache *)0x0;
    if (this_01 != (BreakCache *)0x0) {
      BreakCache::BreakCache(this_01,this,(UErrorCode *)ctx);
      local_68 = this_01;
    }
    this->fBreakCache = local_68;
    UVar1 = ::U_SUCCESS(*(UErrorCode *)ctx);
    pRVar2 = (RuleBasedBreakIterator *)CONCAT71(extraout_var_00,UVar1);
    if ((UVar1 != '\0') &&
       ((this->fDictionaryCache == (DictionaryCache *)0x0 ||
        (pRVar2 = this, this->fBreakCache == (BreakCache *)0x0)))) {
      *(undefined4 *)ctx = 7;
      pRVar2 = (RuleBasedBreakIterator *)ctx;
    }
  }
  return (int)pRVar2;
}

Assistant:

void RuleBasedBreakIterator::init(UErrorCode &status) {
    fCharIter             = NULL;
    fData                 = NULL;
    fPosition             = 0;
    fRuleStatusIndex      = 0;
    fDone                 = false;
    fDictionaryCharCount  = 0;
    fLanguageBreakEngines = NULL;
    fUnhandledBreakEngine = NULL;
    fBreakCache           = NULL;
    fDictionaryCache      = NULL;

    // Note: IBM xlC is unable to assign or initialize member fText from UTEXT_INITIALIZER.
    // fText                 = UTEXT_INITIALIZER;
    static const UText initializedUText = UTEXT_INITIALIZER;
    uprv_memcpy(&fText, &initializedUText, sizeof(UText));

   if (U_FAILURE(status)) {
        return;
    }

    utext_openUChars(&fText, NULL, 0, &status);
    fDictionaryCache = new DictionaryCache(this, status);
    fBreakCache      = new BreakCache(this, status);
    if (U_SUCCESS(status) && (fDictionaryCache == NULL || fBreakCache == NULL)) {
        status = U_MEMORY_ALLOCATION_ERROR;
    }

#ifdef RBBI_DEBUG
    static UBool debugInitDone = FALSE;
    if (debugInitDone == FALSE) {
        char *debugEnv = getenv("U_RBBIDEBUG");
        if (debugEnv && uprv_strstr(debugEnv, "trace")) {
            gTrace = TRUE;
        }
        debugInitDone = TRUE;
    }
#endif
}